

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test::
~SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test
          (SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableDeclarationTypeMismatchThrows3)
{
  std::string source = R"SRC(
  fn f(): function
  {
    ret \(x: f32): void = { };
  }
  
  fn main(): f32
  {
    let x: f32 = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}